

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

bool __thiscall flexbuffers::Verifier::VerifyRef(Verifier *this,Reference r)

{
  ulong uVar1;
  bool bVar2;
  Type TVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  size_t o;
  ulong uVar7;
  byte byte_width;
  uint8_t *p;
  int iVar8;
  long lVar9;
  Reference r_00;
  Reference r_01;
  Reference r_02;
  uint8_t len;
  byte local_29;
  
  uVar6 = r._8_8_;
  r_00.data_ = (ulong *)r.data_;
  byte_width = r.byte_width_;
  if (8 < byte_width) {
    return false;
  }
  if ((0x116U >> (r._9_4_ & 0x1f) & 1) == 0) {
    return false;
  }
  TVar3 = r.type_;
  if (FBT_VECTOR_BOOL < TVar3) {
    return false;
  }
  if ((TVar3 < (FBT_BOOL|FBT_INT)) &&
     ((0x400000fU >> (TVar3 & (FBT_VECTOR_FLOAT4|FBT_INDIRECT_UINT)) & 1) != 0)) {
    return true;
  }
  bVar5 = r.parent_width_;
  if (bVar5 < 4) {
    if (bVar5 < 2) {
      uVar7 = (ulong)(byte)*r_00.data_;
    }
    else {
      uVar7 = (ulong)(ushort)*r_00.data_;
    }
  }
  else if (bVar5 < 8) {
    uVar7 = (ulong)(uint)*r_00.data_;
  }
  else {
    uVar7 = *r_00.data_;
  }
  uVar1 = this->size_;
  if ((ulong)((long)r_00.data_ - (long)this->buf_) < uVar7 || uVar1 < uVar7) {
    return false;
  }
  uVar4 = uVar6 >> 8 & 0xff;
  if (bVar5 < 4) {
    if (bVar5 < 2) {
      uVar7 = uVar7 & 0xff;
    }
    else {
      uVar7 = (ulong)(ushort)*r_00.data_;
    }
  }
  else if (bVar5 < 8) {
    uVar7 = (ulong)(uint)*r_00.data_;
  }
  else {
    uVar7 = *r_00.data_;
  }
  p = (uint8_t *)((long)r_00.data_ - uVar7);
  uVar7 = (long)p - (long)this->buf_;
  if (((uVar7 & uVar4 - 1) != 0) && ((this->check_alignment_ & 1U) != 0)) {
    return false;
  }
  iVar8 = (int)uVar4;
  switch(TVar3) {
  case FBT_KEY:
    bVar2 = VerifyKey(this,p);
    return bVar2;
  case FBT_STRING:
    r_00._8_8_ = uVar6 & 0x3fffff00ff | (ulong)(uint)(iVar8 << 8);
    bVar2 = VerifyVector(this,r_00,p,FBT_UINT);
    if (!bVar2) {
      return false;
    }
    lVar9 = -uVar4;
    if (byte_width < 4) {
      if (byte_width < 2) {
        uVar4 = (ulong)p[lVar9];
      }
      else {
        uVar4 = (ulong)*(ushort *)(p + lVar9);
      }
    }
    else if (byte_width < 8) {
      uVar4 = (ulong)*(uint *)(p + lVar9);
    }
    else {
      uVar4 = *(ulong *)(p + lVar9);
    }
    uVar4 = uVar4 + 1;
    goto LAB_002fe9df;
  case FBT_INDIRECT_INT:
  case FBT_INDIRECT_UINT:
  case FBT_INDIRECT_FLOAT:
    return uVar7 <= uVar1 - uVar4 && uVar4 < uVar1;
  case FBT_MAP:
    r_01._8_8_ = uVar6 & 0x3fffff00ff | (ulong)(uint)(iVar8 << 8);
    r_01.data_ = (uint8_t *)r_00.data_;
    bVar2 = VerifyVector(this,r_01,p,FBT_NULL);
    if (bVar2) {
      bVar2 = VerifyKeys(this,p,byte_width);
      return bVar2;
    }
    return false;
  case FBT_VECTOR:
    uVar6 = uVar6 & 0x3fffff00ff | (ulong)(uint)(iVar8 << 8);
    TVar3 = FBT_NULL;
    break;
  case FBT_VECTOR_INT:
    uVar6 = uVar6 & 0x3fffff00ff | (ulong)(uint)(iVar8 << 8);
    TVar3 = FBT_INT;
    break;
  case FBT_VECTOR_UINT:
  case FBT_BLOB:
  case FBT_VECTOR_BOOL:
    uVar6 = uVar6 & 0x3fffff00ff | (ulong)(uint)(iVar8 << 8);
    TVar3 = FBT_UINT;
    break;
  case FBT_VECTOR_FLOAT:
    uVar6 = uVar6 & 0x3fffff00ff | (ulong)(uint)(iVar8 << 8);
    TVar3 = FBT_FLOAT;
    break;
  case FBT_VECTOR_KEY:
  case FBT_VECTOR_STRING_DEPRECATED:
    uVar6 = uVar6 & 0x3fffff00ff | (ulong)(uint)(iVar8 << 8);
    TVar3 = FBT_KEY;
    break;
  case FBT_VECTOR_INT2:
  case FBT_VECTOR_UINT2:
  case FBT_VECTOR_FLOAT2:
  case FBT_VECTOR_INT3:
  case FBT_VECTOR_UINT3:
  case FBT_VECTOR_FLOAT3:
  case FBT_VECTOR_INT4:
  case FBT_VECTOR_UINT4:
  case FBT_VECTOR_FLOAT4:
    local_29 = 0;
    TVar3 = ToFixedTypedVectorElementType(TVar3,&local_29);
    if (FBT_VECTOR_BOOL < TVar3) {
      return false;
    }
    uVar4 = local_29 * uVar4;
LAB_002fe9df:
    return (ulong)((long)p - (long)this->buf_) <= this->size_ - uVar4 && uVar4 < this->size_;
  default:
    return false;
  }
  r_02.parent_width_ = (char)uVar6;
  r_02.byte_width_ = (char)(uVar6 >> 8);
  r_02._10_2_ = (short)(uVar6 >> 0x10);
  r_02.type_ = (int)(uVar6 >> 0x20);
  r_02.data_ = (uint8_t *)r_00.data_;
  bVar2 = VerifyVector(this,r_02,p,TVar3);
  return bVar2;
}

Assistant:

bool VerifyRef(Reference r) {
    // r.parent_width_ and r.data_ already verified.
    if (!VerifyByteWidth(r.byte_width_) || !VerifyType(r.type_)) {
      return false;
    }
    if (IsInline(r.type_)) {
      // Inline scalars, don't require further verification.
      return true;
    }
    // All remaining types are an offset.
    auto off = ReadUInt64(r.data_, r.parent_width_);
    if (!VerifyOffset(off, r.data_)) return false;
    auto p = r.Indirect();
    if (!VerifyAlignment(p, r.byte_width_)) return false;
    switch (r.type_) {
      case FBT_INDIRECT_INT:
      case FBT_INDIRECT_UINT:
      case FBT_INDIRECT_FLOAT: return VerifyFromPointer(p, r.byte_width_);
      case FBT_KEY: return VerifyKey(p);
      case FBT_MAP:
        return VerifyVector(r, p, FBT_NULL) && VerifyKeys(p, r.byte_width_);
      case FBT_VECTOR: return VerifyVector(r, p, FBT_NULL);
      case FBT_VECTOR_INT: return VerifyVector(r, p, FBT_INT);
      case FBT_VECTOR_BOOL:
      case FBT_VECTOR_UINT: return VerifyVector(r, p, FBT_UINT);
      case FBT_VECTOR_FLOAT: return VerifyVector(r, p, FBT_FLOAT);
      case FBT_VECTOR_KEY: return VerifyVector(r, p, FBT_KEY);
      case FBT_VECTOR_STRING_DEPRECATED:
        // Use of FBT_KEY here intentional, see elsewhere.
        return VerifyVector(r, p, FBT_KEY);
      case FBT_BLOB: return VerifyVector(r, p, FBT_UINT);
      case FBT_STRING:
        return VerifyVector(r, p, FBT_UINT) &&
               VerifyTerminator(String(p, r.byte_width_));
      case FBT_VECTOR_INT2:
      case FBT_VECTOR_UINT2:
      case FBT_VECTOR_FLOAT2:
      case FBT_VECTOR_INT3:
      case FBT_VECTOR_UINT3:
      case FBT_VECTOR_FLOAT3:
      case FBT_VECTOR_INT4:
      case FBT_VECTOR_UINT4:
      case FBT_VECTOR_FLOAT4: {
        uint8_t len = 0;
        auto vtype = ToFixedTypedVectorElementType(r.type_, &len);
        if (!VerifyType(vtype)) return false;
        return VerifyFromPointer(p, static_cast<size_t>(r.byte_width_) * len);
      }
      default: return false;
    }
  }